

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

bool google::protobuf::internal::WireFormat::ParseAndMergeField
               (uint32_t tag,FieldDescriptor *field,Message *message,CodedInputStream *input)

{
  Reflection *pRVar1;
  CodedInputStream *pCVar2;
  Message *pMVar3;
  uint32_t tag_00;
  bool bVar4;
  WireType WVar5;
  WireType WVar6;
  Type TVar7;
  int iVar8;
  Syntax SVar9;
  UnknownFieldSet *pUVar10;
  Descriptor *this;
  FileDescriptor *this_00;
  EnumDescriptor *this_01;
  char *pcVar11;
  char *pcVar12;
  MessageFactory *pMVar13;
  Message *local_200;
  Message *sub_message_1;
  Message *sub_message;
  string local_1d0;
  undefined1 local_1b0 [8];
  string value_29;
  string local_170;
  int local_150;
  undefined1 local_140 [8];
  string value_28;
  int local_118;
  bool strict_utf8_check;
  int value_27;
  bool value_26;
  double value_25;
  int64_t iStack_100;
  float value_24;
  int64_t value_23;
  uint64_t uStack_f0;
  int32_t value_22;
  uint64_t value_21;
  uint64_t uStack_e0;
  uint32_t value_20;
  uint64_t value_19;
  int64_t iStack_d0;
  uint32_t value_18;
  int64_t value_17;
  int64_t iStack_c0;
  int32_t value_16;
  int64_t value_15;
  uint64_t uStack_b0;
  int32_t value_14;
  int64_t sign_extended_value;
  EnumValueDescriptor *enum_value;
  int value_13;
  bool value_12;
  double value_11;
  int64_t iStack_88;
  float value_10;
  int64_t value_9;
  uint64_t uStack_78;
  int32_t value_8;
  uint64_t value_7;
  uint64_t uStack_68;
  uint32_t value_6;
  uint64_t value_5;
  int64_t iStack_58;
  uint32_t value_4;
  int64_t value_3;
  int64_t iStack_48;
  int32_t value_2;
  int64_t value_1;
  int32_t value;
  Limit limit;
  uint32_t length;
  anon_enum_32 value_format;
  Reflection *message_reflection;
  CodedInputStream *input_local;
  Message *message_local;
  FieldDescriptor *field_local;
  uint32_t tag_local;
  
  message_reflection = (Reflection *)input;
  input_local = (CodedInputStream *)message;
  message_local = (Message *)field;
  field_local._0_4_ = tag;
  _length = Message::GetReflection(message);
  if (message_local == (Message *)0x0) {
    limit = 0;
  }
  else {
    WVar5 = WireFormatLite::GetTagWireType((uint32_t)field_local);
    TVar7 = FieldDescriptor::type((FieldDescriptor *)message_local);
    WVar6 = WireTypeForFieldType(TVar7);
    if (WVar5 == WVar6) {
      limit = 1;
    }
    else {
      bVar4 = FieldDescriptor::is_packable((FieldDescriptor *)message_local);
      if ((bVar4) &&
         (WVar5 = WireFormatLite::GetTagWireType((uint32_t)field_local),
         WVar5 == WIRETYPE_LENGTH_DELIMITED)) {
        limit = 2;
      }
      else {
        limit = 0;
      }
    }
  }
  tag_00 = (uint32_t)field_local;
  pRVar1 = message_reflection;
  if (limit == 0) {
    pUVar10 = Reflection::MutableUnknownFields(_length,(Message *)input_local);
    field_local._7_1_ = SkipField((CodedInputStream *)pRVar1,tag_00,pUVar10);
    goto LAB_0073a19e;
  }
  if (limit == 2) {
    bVar4 = io::CodedInputStream::ReadVarint32
                      ((CodedInputStream *)message_reflection,(uint32_t *)&value);
    if (!bVar4) {
      field_local._7_1_ = 0;
      goto LAB_0073a19e;
    }
    value_1._4_4_ = io::CodedInputStream::PushLimit((CodedInputStream *)message_reflection,value);
    TVar7 = FieldDescriptor::type((FieldDescriptor *)message_local);
    switch(TVar7) {
    case TYPE_DOUBLE:
      while (iVar8 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)message_reflection),
            0 < iVar8) {
        bVar4 = WireFormatLite::
                ReadPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                          ((CodedInputStream *)message_reflection,(double *)&value_13);
        if (!bVar4) {
          field_local._7_1_ = 0;
          goto LAB_0073a19e;
        }
        Reflection::AddDouble
                  (_length,(Message *)input_local,(FieldDescriptor *)message_local,_value_13);
      }
      break;
    case TYPE_FLOAT:
      while (iVar8 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)message_reflection),
            0 < iVar8) {
        bVar4 = WireFormatLite::
                ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                          ((CodedInputStream *)message_reflection,(float *)((long)&value_11 + 4));
        if (!bVar4) {
          field_local._7_1_ = 0;
          goto LAB_0073a19e;
        }
        Reflection::AddFloat
                  (_length,(Message *)input_local,(FieldDescriptor *)message_local,value_11._4_4_);
      }
      break;
    case TYPE_INT64:
      while (iVar8 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)message_reflection),
            0 < iVar8) {
        bVar4 = WireFormatLite::
                ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                          ((CodedInputStream *)message_reflection,&stack0xffffffffffffffb8);
        if (!bVar4) {
          field_local._7_1_ = 0;
          goto LAB_0073a19e;
        }
        Reflection::AddInt64
                  (_length,(Message *)input_local,(FieldDescriptor *)message_local,iStack_48);
      }
      break;
    case TYPE_UINT64:
      while (iVar8 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)message_reflection),
            0 < iVar8) {
        bVar4 = WireFormatLite::
                ReadPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                          ((CodedInputStream *)message_reflection,&stack0xffffffffffffff98);
        if (!bVar4) {
          field_local._7_1_ = 0;
          goto LAB_0073a19e;
        }
        Reflection::AddUInt64
                  (_length,(Message *)input_local,(FieldDescriptor *)message_local,uStack_68);
      }
      break;
    case TYPE_INT32:
      while (iVar8 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)message_reflection),
            0 < iVar8) {
        bVar4 = WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                          ((CodedInputStream *)message_reflection,(int32_t *)&value_1);
        if (!bVar4) {
          field_local._7_1_ = 0;
          goto LAB_0073a19e;
        }
        Reflection::AddInt32
                  (_length,(Message *)input_local,(FieldDescriptor *)message_local,(int32_t)value_1)
        ;
      }
      break;
    case TYPE_FIXED64:
      while (iVar8 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)message_reflection),
            0 < iVar8) {
        bVar4 = WireFormatLite::
                ReadPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)6>
                          ((CodedInputStream *)message_reflection,&stack0xffffffffffffff88);
        if (!bVar4) {
          field_local._7_1_ = 0;
          goto LAB_0073a19e;
        }
        Reflection::AddUInt64
                  (_length,(Message *)input_local,(FieldDescriptor *)message_local,uStack_78);
      }
      break;
    case TYPE_FIXED32:
      while (iVar8 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)message_reflection),
            0 < iVar8) {
        bVar4 = WireFormatLite::
                ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)7>
                          ((CodedInputStream *)message_reflection,(uint32_t *)((long)&value_7 + 4));
        if (!bVar4) {
          field_local._7_1_ = 0;
          goto LAB_0073a19e;
        }
        Reflection::AddUInt32
                  (_length,(Message *)input_local,(FieldDescriptor *)message_local,value_7._4_4_);
      }
      break;
    case TYPE_BOOL:
      while (iVar8 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)message_reflection),
            0 < iVar8) {
        bVar4 = WireFormatLite::
                ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                          ((CodedInputStream *)message_reflection,(bool *)((long)&enum_value + 7));
        if (!bVar4) {
          field_local._7_1_ = 0;
          goto LAB_0073a19e;
        }
        Reflection::AddBool(_length,(Message *)input_local,(FieldDescriptor *)message_local,
                            (bool)(enum_value._7_1_ & 1));
      }
      break;
    case TYPE_STRING:
    case TYPE_GROUP:
    case TYPE_MESSAGE:
    case TYPE_BYTES:
      field_local._7_1_ = 0;
      goto LAB_0073a19e;
    case TYPE_UINT32:
      while (iVar8 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)message_reflection),
            0 < iVar8) {
        bVar4 = WireFormatLite::
                ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
                          ((CodedInputStream *)message_reflection,(uint32_t *)((long)&value_5 + 4));
        if (!bVar4) {
          field_local._7_1_ = 0;
          goto LAB_0073a19e;
        }
        Reflection::AddUInt32
                  (_length,(Message *)input_local,(FieldDescriptor *)message_local,value_5._4_4_);
      }
      break;
    case TYPE_ENUM:
      while (iVar8 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)message_reflection),
            0 < iVar8) {
        bVar4 = WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                          ((CodedInputStream *)message_reflection,(int *)&enum_value);
        if (!bVar4) {
          field_local._7_1_ = 0;
          goto LAB_0073a19e;
        }
        this = Message::GetDescriptor((Message *)input_local);
        this_00 = Descriptor::file(this);
        SVar9 = FileDescriptor::syntax(this_00);
        if (SVar9 == SYNTAX_PROTO3) {
          Reflection::AddEnumValue
                    (_length,(Message *)input_local,(FieldDescriptor *)message_local,(int)enum_value
                    );
        }
        else {
          this_01 = FieldDescriptor::enum_type((FieldDescriptor *)message_local);
          sign_extended_value = (int64_t)EnumDescriptor::FindValueByNumber(this_01,(int)enum_value);
          if ((EnumValueDescriptor *)sign_extended_value == (EnumValueDescriptor *)0x0) {
            uStack_b0 = (uint64_t)(int)enum_value;
            pUVar10 = Reflection::MutableUnknownFields(_length,(Message *)input_local);
            iVar8 = WireFormatLite::GetTagFieldNumber((uint32_t)field_local);
            UnknownFieldSet::AddVarint(pUVar10,iVar8,uStack_b0);
          }
          else {
            Reflection::AddEnum(_length,(Message *)input_local,(FieldDescriptor *)message_local,
                                (EnumValueDescriptor *)sign_extended_value);
          }
        }
      }
      break;
    case TYPE_SFIXED32:
      while (iVar8 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)message_reflection),
            0 < iVar8) {
        bVar4 = WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)15>
                          ((CodedInputStream *)message_reflection,(int32_t *)((long)&value_9 + 4));
        if (!bVar4) {
          field_local._7_1_ = 0;
          goto LAB_0073a19e;
        }
        Reflection::AddInt32
                  (_length,(Message *)input_local,(FieldDescriptor *)message_local,value_9._4_4_);
      }
      break;
    case TYPE_SFIXED64:
      while (iVar8 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)message_reflection),
            0 < iVar8) {
        bVar4 = WireFormatLite::
                ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)16>
                          ((CodedInputStream *)message_reflection,&stack0xffffffffffffff78);
        if (!bVar4) {
          field_local._7_1_ = 0;
          goto LAB_0073a19e;
        }
        Reflection::AddInt64
                  (_length,(Message *)input_local,(FieldDescriptor *)message_local,iStack_88);
      }
      break;
    case TYPE_SINT32:
      while (iVar8 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)message_reflection),
            0 < iVar8) {
        bVar4 = WireFormatLite::
                ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)17>
                          ((CodedInputStream *)message_reflection,(int32_t *)((long)&value_3 + 4));
        if (!bVar4) {
          field_local._7_1_ = 0;
          goto LAB_0073a19e;
        }
        Reflection::AddInt32
                  (_length,(Message *)input_local,(FieldDescriptor *)message_local,value_3._4_4_);
      }
      break;
    case MAX_TYPE:
      while (iVar8 = io::CodedInputStream::BytesUntilLimit((CodedInputStream *)message_reflection),
            0 < iVar8) {
        bVar4 = WireFormatLite::
                ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)18>
                          ((CodedInputStream *)message_reflection,&stack0xffffffffffffffa8);
        if (!bVar4) {
          field_local._7_1_ = 0;
          goto LAB_0073a19e;
        }
        Reflection::AddInt64
                  (_length,(Message *)input_local,(FieldDescriptor *)message_local,iStack_58);
      }
    }
    io::CodedInputStream::PopLimit((CodedInputStream *)message_reflection,value_1._4_4_);
    goto LAB_0073a19a;
  }
  TVar7 = FieldDescriptor::type((FieldDescriptor *)message_local);
  switch(TVar7) {
  case TYPE_DOUBLE:
    bVar4 = WireFormatLite::
            ReadPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                      ((CodedInputStream *)message_reflection,(double *)&value_27);
    if (!bVar4) {
      field_local._7_1_ = 0;
      goto LAB_0073a19e;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
    if (bVar4) {
      Reflection::AddDouble
                (_length,(Message *)input_local,(FieldDescriptor *)message_local,_value_27);
    }
    else {
      Reflection::SetDouble
                (_length,(Message *)input_local,(FieldDescriptor *)message_local,_value_27);
    }
    break;
  case TYPE_FLOAT:
    bVar4 = WireFormatLite::
            ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                      ((CodedInputStream *)message_reflection,(float *)((long)&value_25 + 4));
    if (!bVar4) {
      field_local._7_1_ = 0;
      goto LAB_0073a19e;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
    if (bVar4) {
      Reflection::AddFloat
                (_length,(Message *)input_local,(FieldDescriptor *)message_local,value_25._4_4_);
    }
    else {
      Reflection::SetFloat
                (_length,(Message *)input_local,(FieldDescriptor *)message_local,value_25._4_4_);
    }
    break;
  case TYPE_INT64:
    bVar4 = WireFormatLite::
            ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)3>
                      ((CodedInputStream *)message_reflection,&stack0xffffffffffffff40);
    if (!bVar4) {
      field_local._7_1_ = 0;
      goto LAB_0073a19e;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
    if (bVar4) {
      Reflection::AddInt64
                (_length,(Message *)input_local,(FieldDescriptor *)message_local,iStack_c0);
    }
    else {
      Reflection::SetInt64
                (_length,(Message *)input_local,(FieldDescriptor *)message_local,iStack_c0);
    }
    break;
  case TYPE_UINT64:
    bVar4 = WireFormatLite::
            ReadPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                      ((CodedInputStream *)message_reflection,&stack0xffffffffffffff20);
    if (!bVar4) {
      field_local._7_1_ = 0;
      goto LAB_0073a19e;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
    if (bVar4) {
      Reflection::AddUInt64
                (_length,(Message *)input_local,(FieldDescriptor *)message_local,uStack_e0);
    }
    else {
      Reflection::SetUInt64
                (_length,(Message *)input_local,(FieldDescriptor *)message_local,uStack_e0);
    }
    break;
  case TYPE_INT32:
    bVar4 = WireFormatLite::
            ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                      ((CodedInputStream *)message_reflection,(int32_t *)((long)&value_15 + 4));
    if (!bVar4) {
      field_local._7_1_ = 0;
      goto LAB_0073a19e;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
    if (bVar4) {
      Reflection::AddInt32
                (_length,(Message *)input_local,(FieldDescriptor *)message_local,value_15._4_4_);
    }
    else {
      Reflection::SetInt32
                (_length,(Message *)input_local,(FieldDescriptor *)message_local,value_15._4_4_);
    }
    break;
  case TYPE_FIXED64:
    bVar4 = WireFormatLite::
            ReadPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)6>
                      ((CodedInputStream *)message_reflection,&stack0xffffffffffffff10);
    if (!bVar4) {
      field_local._7_1_ = 0;
      goto LAB_0073a19e;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
    if (bVar4) {
      Reflection::AddUInt64
                (_length,(Message *)input_local,(FieldDescriptor *)message_local,uStack_f0);
    }
    else {
      Reflection::SetUInt64
                (_length,(Message *)input_local,(FieldDescriptor *)message_local,uStack_f0);
    }
    break;
  case TYPE_FIXED32:
    bVar4 = WireFormatLite::
            ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)7>
                      ((CodedInputStream *)message_reflection,(uint32_t *)((long)&value_21 + 4));
    if (!bVar4) {
      field_local._7_1_ = 0;
      goto LAB_0073a19e;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
    if (bVar4) {
      Reflection::AddUInt32
                (_length,(Message *)input_local,(FieldDescriptor *)message_local,value_21._4_4_);
    }
    else {
      Reflection::SetUInt32
                (_length,(Message *)input_local,(FieldDescriptor *)message_local,value_21._4_4_);
    }
    break;
  case TYPE_BOOL:
    bVar4 = WireFormatLite::
            ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                      ((CodedInputStream *)message_reflection,&strict_utf8_check);
    if (!bVar4) {
      field_local._7_1_ = 0;
      goto LAB_0073a19e;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
    if (bVar4) {
      Reflection::AddBool(_length,(Message *)input_local,(FieldDescriptor *)message_local,
                          (bool)(strict_utf8_check & 1));
    }
    else {
      Reflection::SetBool(_length,(Message *)input_local,(FieldDescriptor *)message_local,
                          (bool)(strict_utf8_check & 1));
    }
    break;
  case TYPE_STRING:
    value_28.field_2._M_local_buf[0xf] = StrictUtf8Check((FieldDescriptor *)message_local);
    std::__cxx11::string::string((string *)local_140);
    bVar4 = WireFormatLite::ReadString((CodedInputStream *)message_reflection,(string *)local_140);
    if (bVar4) {
      if ((value_28.field_2._M_local_buf[0xf] & 1U) == 0) {
        pcVar11 = (char *)std::__cxx11::string::data();
        iVar8 = std::__cxx11::string::length();
        FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)message_local);
        pcVar12 = (char *)std::__cxx11::string::c_str();
        VerifyUTF8StringNamedField(pcVar11,iVar8,PARSE,pcVar12);
      }
      else {
        pcVar11 = (char *)std::__cxx11::string::data();
        iVar8 = std::__cxx11::string::length();
        FieldDescriptor::full_name_abi_cxx11_((FieldDescriptor *)message_local);
        pcVar12 = (char *)std::__cxx11::string::c_str();
        bVar4 = WireFormatLite::VerifyUtf8String(pcVar11,iVar8,PARSE,pcVar12);
        if (!bVar4) {
          field_local._7_1_ = 0;
          local_150 = 1;
          goto LAB_00739def;
        }
      }
      bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
      pMVar3 = message_local;
      pCVar2 = input_local;
      pRVar1 = _length;
      if (bVar4) {
        std::__cxx11::string::string((string *)&local_170,(string *)local_140);
        Reflection::AddString(pRVar1,(Message *)pCVar2,(FieldDescriptor *)pMVar3,&local_170);
        std::__cxx11::string::~string((string *)&local_170);
      }
      else {
        std::__cxx11::string::string
                  ((string *)(value_29.field_2._M_local_buf + 8),(string *)local_140);
        Reflection::SetString
                  (pRVar1,(Message *)pCVar2,(FieldDescriptor *)pMVar3,
                   (string *)((long)&value_29.field_2 + 8));
        std::__cxx11::string::~string((string *)(value_29.field_2._M_local_buf + 8));
      }
      local_150 = 0x1f;
    }
    else {
      field_local._7_1_ = 0;
      local_150 = 1;
    }
LAB_00739def:
    std::__cxx11::string::~string((string *)local_140);
    goto joined_r0x00739fd6;
  case TYPE_GROUP:
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
    pMVar3 = message_local;
    pCVar2 = input_local;
    pRVar1 = _length;
    if (bVar4) {
      pMVar13 = io::CodedInputStream::GetExtensionFactory((CodedInputStream *)message_reflection);
      sub_message_1 =
           Reflection::AddMessage(pRVar1,(Message *)pCVar2,(FieldDescriptor *)pMVar3,pMVar13);
    }
    else {
      pMVar13 = io::CodedInputStream::GetExtensionFactory((CodedInputStream *)message_reflection);
      sub_message_1 =
           Reflection::MutableMessage(pRVar1,(Message *)pCVar2,(FieldDescriptor *)pMVar3,pMVar13);
    }
    iVar8 = WireFormatLite::GetTagFieldNumber((uint32_t)field_local);
    bVar4 = WireFormatLite::ReadGroup<google::protobuf::Message>
                      (iVar8,(CodedInputStream *)message_reflection,sub_message_1);
    if (!bVar4) {
      field_local._7_1_ = 0;
      goto LAB_0073a19e;
    }
    break;
  case TYPE_MESSAGE:
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
    pMVar3 = message_local;
    pCVar2 = input_local;
    pRVar1 = _length;
    if (bVar4) {
      pMVar13 = io::CodedInputStream::GetExtensionFactory((CodedInputStream *)message_reflection);
      local_200 = Reflection::AddMessage(pRVar1,(Message *)pCVar2,(FieldDescriptor *)pMVar3,pMVar13)
      ;
    }
    else {
      pMVar13 = io::CodedInputStream::GetExtensionFactory((CodedInputStream *)message_reflection);
      local_200 = Reflection::MutableMessage
                            (pRVar1,(Message *)pCVar2,(FieldDescriptor *)pMVar3,pMVar13);
    }
    bVar4 = WireFormatLite::ReadMessage<google::protobuf::Message>
                      ((CodedInputStream *)message_reflection,local_200);
    if (!bVar4) {
      field_local._7_1_ = 0;
      goto LAB_0073a19e;
    }
    break;
  case TYPE_BYTES:
    std::__cxx11::string::string((string *)local_1b0);
    bVar4 = WireFormatLite::ReadBytes((CodedInputStream *)message_reflection,(string *)local_1b0);
    if (bVar4) {
      bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
      pMVar3 = message_local;
      pCVar2 = input_local;
      pRVar1 = _length;
      if (bVar4) {
        std::__cxx11::string::string((string *)&local_1d0,(string *)local_1b0);
        Reflection::AddString(pRVar1,(Message *)pCVar2,(FieldDescriptor *)pMVar3,&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
      }
      else {
        std::__cxx11::string::string((string *)&sub_message,(string *)local_1b0);
        Reflection::SetString
                  (pRVar1,(Message *)pCVar2,(FieldDescriptor *)pMVar3,(string *)&sub_message);
        std::__cxx11::string::~string((string *)&sub_message);
      }
      local_150 = 0x1f;
    }
    else {
      field_local._7_1_ = 0;
      local_150 = 1;
    }
    std::__cxx11::string::~string((string *)local_1b0);
joined_r0x00739fd6:
    if (local_150 == 1) goto LAB_0073a19e;
    break;
  case TYPE_UINT32:
    bVar4 = WireFormatLite::
            ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
                      ((CodedInputStream *)message_reflection,(uint32_t *)((long)&value_19 + 4));
    if (!bVar4) {
      field_local._7_1_ = 0;
      goto LAB_0073a19e;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
    if (bVar4) {
      Reflection::AddUInt32
                (_length,(Message *)input_local,(FieldDescriptor *)message_local,value_19._4_4_);
    }
    else {
      Reflection::SetUInt32
                (_length,(Message *)input_local,(FieldDescriptor *)message_local,value_19._4_4_);
    }
    break;
  case TYPE_ENUM:
    bVar4 = WireFormatLite::
            ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                      ((CodedInputStream *)message_reflection,&local_118);
    if (!bVar4) {
      field_local._7_1_ = 0;
      goto LAB_0073a19e;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
    if (bVar4) {
      Reflection::AddEnumValue
                (_length,(Message *)input_local,(FieldDescriptor *)message_local,local_118);
    }
    else {
      Reflection::SetEnumValue
                (_length,(Message *)input_local,(FieldDescriptor *)message_local,local_118);
    }
    break;
  case TYPE_SFIXED32:
    bVar4 = WireFormatLite::
            ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)15>
                      ((CodedInputStream *)message_reflection,(int32_t *)((long)&value_23 + 4));
    if (!bVar4) {
      field_local._7_1_ = 0;
      goto LAB_0073a19e;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
    if (bVar4) {
      Reflection::AddInt32
                (_length,(Message *)input_local,(FieldDescriptor *)message_local,value_23._4_4_);
    }
    else {
      Reflection::SetInt32
                (_length,(Message *)input_local,(FieldDescriptor *)message_local,value_23._4_4_);
    }
    break;
  case TYPE_SFIXED64:
    bVar4 = WireFormatLite::
            ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)16>
                      ((CodedInputStream *)message_reflection,&stack0xffffffffffffff00);
    if (!bVar4) {
      field_local._7_1_ = 0;
      goto LAB_0073a19e;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
    if (bVar4) {
      Reflection::AddInt64
                (_length,(Message *)input_local,(FieldDescriptor *)message_local,iStack_100);
    }
    else {
      Reflection::SetInt64
                (_length,(Message *)input_local,(FieldDescriptor *)message_local,iStack_100);
    }
    break;
  case TYPE_SINT32:
    bVar4 = WireFormatLite::
            ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)17>
                      ((CodedInputStream *)message_reflection,(int32_t *)((long)&value_17 + 4));
    if (!bVar4) {
      field_local._7_1_ = 0;
      goto LAB_0073a19e;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
    if (bVar4) {
      Reflection::AddInt32
                (_length,(Message *)input_local,(FieldDescriptor *)message_local,value_17._4_4_);
    }
    else {
      Reflection::SetInt32
                (_length,(Message *)input_local,(FieldDescriptor *)message_local,value_17._4_4_);
    }
    break;
  case MAX_TYPE:
    bVar4 = WireFormatLite::
            ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)18>
                      ((CodedInputStream *)message_reflection,&stack0xffffffffffffff30);
    if (!bVar4) {
      field_local._7_1_ = 0;
      goto LAB_0073a19e;
    }
    bVar4 = FieldDescriptor::is_repeated((FieldDescriptor *)message_local);
    if (bVar4) {
      Reflection::AddInt64
                (_length,(Message *)input_local,(FieldDescriptor *)message_local,iStack_d0);
    }
    else {
      Reflection::SetInt64
                (_length,(Message *)input_local,(FieldDescriptor *)message_local,iStack_d0);
    }
  }
LAB_0073a19a:
  field_local._7_1_ = 1;
LAB_0073a19e:
  return (bool)(field_local._7_1_ & 1);
}

Assistant:

bool WireFormat::ParseAndMergeField(
    uint32_t tag,
    const FieldDescriptor* field,  // May be nullptr for unknown
    Message* message, io::CodedInputStream* input) {
  const Reflection* message_reflection = message->GetReflection();

  enum { UNKNOWN, NORMAL_FORMAT, PACKED_FORMAT } value_format;

  if (field == nullptr) {
    value_format = UNKNOWN;
  } else if (WireFormatLite::GetTagWireType(tag) ==
             WireTypeForFieldType(field->type())) {
    value_format = NORMAL_FORMAT;
  } else if (field->is_packable() &&
             WireFormatLite::GetTagWireType(tag) ==
                 WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    value_format = PACKED_FORMAT;
  } else {
    // We don't recognize this field. Either the field number is unknown
    // or the wire type doesn't match. Put it in our unknown field set.
    value_format = UNKNOWN;
  }

  if (value_format == UNKNOWN) {
    return SkipField(input, tag,
                     message_reflection->MutableUnknownFields(message));
  } else if (value_format == PACKED_FORMAT) {
    uint32_t length;
    if (!input->ReadVarint32(&length)) return false;
    io::CodedInputStream::Limit limit = input->PushLimit(length);

    switch (field->type()) {
#define HANDLE_PACKED_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)                      \
  case FieldDescriptor::TYPE_##TYPE: {                                         \
    while (input->BytesUntilLimit() > 0) {                                     \
      CPPTYPE value;                                                           \
      if (!WireFormatLite::ReadPrimitive<CPPTYPE,                              \
                                         WireFormatLite::TYPE_##TYPE>(input,   \
                                                                      &value)) \
        return false;                                                          \
      message_reflection->Add##CPPTYPE_METHOD(message, field, value);          \
    }                                                                          \
    break;                                                                     \
  }

      HANDLE_PACKED_TYPE(INT32, int32_t, Int32)
      HANDLE_PACKED_TYPE(INT64, int64_t, Int64)
      HANDLE_PACKED_TYPE(SINT32, int32_t, Int32)
      HANDLE_PACKED_TYPE(SINT64, int64_t, Int64)
      HANDLE_PACKED_TYPE(UINT32, uint32_t, UInt32)
      HANDLE_PACKED_TYPE(UINT64, uint64_t, UInt64)

      HANDLE_PACKED_TYPE(FIXED32, uint32_t, UInt32)
      HANDLE_PACKED_TYPE(FIXED64, uint64_t, UInt64)
      HANDLE_PACKED_TYPE(SFIXED32, int32_t, Int32)
      HANDLE_PACKED_TYPE(SFIXED64, int64_t, Int64)

      HANDLE_PACKED_TYPE(FLOAT, float, Float)
      HANDLE_PACKED_TYPE(DOUBLE, double, Double)

      HANDLE_PACKED_TYPE(BOOL, bool, Bool)
#undef HANDLE_PACKED_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        while (input->BytesUntilLimit() > 0) {
          int value;
          if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                  input, &value))
            return false;
          if (message->GetDescriptor()->file()->syntax() ==
              FileDescriptor::SYNTAX_PROTO3) {
            message_reflection->AddEnumValue(message, field, value);
          } else {
            const EnumValueDescriptor* enum_value =
                field->enum_type()->FindValueByNumber(value);
            if (enum_value != nullptr) {
              message_reflection->AddEnum(message, field, enum_value);
            } else {
              // The enum value is not one of the known values.  Add it to the
              // UnknownFieldSet.
              int64_t sign_extended_value = static_cast<int64_t>(value);
              message_reflection->MutableUnknownFields(message)->AddVarint(
                  WireFormatLite::GetTagFieldNumber(tag), sign_extended_value);
            }
          }
        }

        break;
      }

      case FieldDescriptor::TYPE_STRING:
      case FieldDescriptor::TYPE_GROUP:
      case FieldDescriptor::TYPE_MESSAGE:
      case FieldDescriptor::TYPE_BYTES:
        // Can't have packed fields of these types: these should be caught by
        // the protocol compiler.
        return false;
        break;
    }

    input->PopLimit(limit);
  } else {
    // Non-packed value (value_format == NORMAL_FORMAT)
    switch (field->type()) {
#define HANDLE_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)                            \
  case FieldDescriptor::TYPE_##TYPE: {                                        \
    CPPTYPE value;                                                            \
    if (!WireFormatLite::ReadPrimitive<CPPTYPE, WireFormatLite::TYPE_##TYPE>( \
            input, &value))                                                   \
      return false;                                                           \
    if (field->is_repeated()) {                                               \
      message_reflection->Add##CPPTYPE_METHOD(message, field, value);         \
    } else {                                                                  \
      message_reflection->Set##CPPTYPE_METHOD(message, field, value);         \
    }                                                                         \
    break;                                                                    \
  }

      HANDLE_TYPE(INT32, int32_t, Int32)
      HANDLE_TYPE(INT64, int64_t, Int64)
      HANDLE_TYPE(SINT32, int32_t, Int32)
      HANDLE_TYPE(SINT64, int64_t, Int64)
      HANDLE_TYPE(UINT32, uint32_t, UInt32)
      HANDLE_TYPE(UINT64, uint64_t, UInt64)

      HANDLE_TYPE(FIXED32, uint32_t, UInt32)
      HANDLE_TYPE(FIXED64, uint64_t, UInt64)
      HANDLE_TYPE(SFIXED32, int32_t, Int32)
      HANDLE_TYPE(SFIXED64, int64_t, Int64)

      HANDLE_TYPE(FLOAT, float, Float)
      HANDLE_TYPE(DOUBLE, double, Double)

      HANDLE_TYPE(BOOL, bool, Bool)
#undef HANDLE_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        int value;
        if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                input, &value))
          return false;
        if (field->is_repeated()) {
          message_reflection->AddEnumValue(message, field, value);
        } else {
          message_reflection->SetEnumValue(message, field, value);
        }
        break;
      }

      // Handle strings separately so that we can optimize the ctype=CORD case.
      case FieldDescriptor::TYPE_STRING: {
        bool strict_utf8_check = StrictUtf8Check(field);
        std::string value;
        if (!WireFormatLite::ReadString(input, &value)) return false;
        if (strict_utf8_check) {
          if (!WireFormatLite::VerifyUtf8String(value.data(), value.length(),
                                                WireFormatLite::PARSE,
                                                field->full_name().c_str())) {
            return false;
          }
        } else {
          VerifyUTF8StringNamedField(value.data(), value.length(), PARSE,
                                     field->full_name().c_str());
        }
        if (field->is_repeated()) {
          message_reflection->AddString(message, field, value);
        } else {
          message_reflection->SetString(message, field, value);
        }
        break;
      }

      case FieldDescriptor::TYPE_BYTES: {
        std::string value;
        if (!WireFormatLite::ReadBytes(input, &value)) return false;
        if (field->is_repeated()) {
          message_reflection->AddString(message, field, value);
        } else {
          message_reflection->SetString(message, field, value);
        }
        break;
      }

      case FieldDescriptor::TYPE_GROUP: {
        Message* sub_message;
        if (field->is_repeated()) {
          sub_message = message_reflection->AddMessage(
              message, field, input->GetExtensionFactory());
        } else {
          sub_message = message_reflection->MutableMessage(
              message, field, input->GetExtensionFactory());
        }

        if (!WireFormatLite::ReadGroup(WireFormatLite::GetTagFieldNumber(tag),
                                       input, sub_message))
          return false;
        break;
      }

      case FieldDescriptor::TYPE_MESSAGE: {
        Message* sub_message;
        if (field->is_repeated()) {
          sub_message = message_reflection->AddMessage(
              message, field, input->GetExtensionFactory());
        } else {
          sub_message = message_reflection->MutableMessage(
              message, field, input->GetExtensionFactory());
        }

        if (!WireFormatLite::ReadMessage(input, sub_message)) return false;
        break;
      }
    }
  }

  return true;
}